

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Store::Mark(Store *this,Ref ref)

{
  bool bVar1;
  Object **ppOVar2;
  reference local_40;
  reference local_30;
  size_t local_20;
  size_t index;
  Store *this_local;
  Ref ref_local;
  
  local_20 = ref.index;
  index = (size_t)this;
  this_local = (Store *)ref.index;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&(this->gc_context_).marks,ref.index);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    local_40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&(this->gc_context_).marks,local_20);
    std::_Bit_reference::operator=(&local_40,true);
    if ((this->gc_context_).call_depth < 10) {
      (this->gc_context_).call_depth = (this->gc_context_).call_depth + 1;
      ppOVar2 = FreeList<wabt::interp::Object_*>::Get(&this->objects_,local_20);
      (*(*ppOVar2)->_vptr_Object[2])(*ppOVar2,this);
      (this->gc_context_).call_depth = (this->gc_context_).call_depth + -1;
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&(this->gc_context_).untraced_objects,&local_20);
    }
  }
  return;
}

Assistant:

void Store::Mark(Ref ref) {
  size_t index = ref.index;

  if (gc_context_.marks[index])
    return;

  gc_context_.marks[index] = true;

  if (WABT_UNLIKELY(gc_context_.call_depth >= max_call_depth)) {
    gc_context_.untraced_objects.push_back(index);
    return;
  }

  gc_context_.call_depth++;
  objects_.Get(index)->Mark(*this);
  gc_context_.call_depth--;
}